

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ClassType::handleExtends
          (ClassType *this,ExtendsClauseSyntax *extendsClause,ASTContext *context,
          function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  char *pcVar1;
  undefined1 uVar2;
  byte bVar3;
  undefined2 uVar4;
  ushort uVar5;
  ushort uVar6;
  Compilation *this_00;
  long lVar7;
  uint uVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  uint uVar15;
  SymbolKind SVar16;
  ClassType *pCVar17;
  Diagnostic *pDVar18;
  Type *pTVar19;
  ClassType *pCVar20;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_01;
  uint64_t uVar21;
  TransparentMemberSymbol *pTVar22;
  SubroutineSymbol *pSVar23;
  Symbol *pSVar24;
  SubroutineSymbol *derivedMethod;
  ulong uVar26;
  SourceLocation SVar27;
  iterator this_02;
  DiagCode code;
  DiagCode code_00;
  DiagCode code_01;
  DiagCode code_02;
  DiagCode code_03;
  ulong uVar28;
  long lVar29;
  iterator iVar30;
  iterator args;
  undefined1 auVar31 [16];
  SourceRange SVar32;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  sVar33;
  iterator iVar25;
  
  this_00 = ((context->scope).ptr)->compilation;
  pCVar17 = Lookup::findClass((extendsClause->baseName).ptr,context,(optional<slang::DiagCode>)0x0);
  if (pCVar17 == (ClassType *)0x0) {
    pTVar19 = this_00->errorType;
LAB_0020847d:
    this->baseClass = pTVar19;
    return;
  }
  if (pCVar17->isInterface == true) {
    this->baseClass = this_00->errorType;
    SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
    code.subsystem = Declarations;
    code.code = 0x39;
  }
  else {
    pCVar20 = pCVar17;
    if (pCVar17->isFinal == false) {
      while (pCVar20 != this) {
        pTVar19 = getBaseClass(pCVar20);
        if ((pTVar19 == (Type *)0x0) || (bVar12 = Type::isError(pTVar19), bVar12)) {
          this->baseClass = &pCVar17->super_Type;
          this_01 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    Scope::getNameMap(&this->super_Scope);
          sVar33 = Scope::members(&pCVar17->super_Scope);
          iVar25 = sVar33._M_end.current;
          bVar12 = false;
          goto LAB_00208572;
        }
        pCVar20 = (ClassType *)Type::getCanonicalType(pTVar19);
      }
      SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
      pDVar18 = ASTContext::addDiag(context,(DiagCode)0x20009,SVar32);
      Diagnostic::operator<<(pDVar18,(this->super_Type).super_Symbol.name);
      pTVar19 = this_00->errorType;
      goto LAB_0020847d;
    }
    this->baseClass = this_00->errorType;
    SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
    code.subsystem = Declarations;
    code.code = 0x38;
  }
  pDVar18 = ASTContext::addDiag(context,code,SVar32);
  Diagnostic::operator<<(pDVar18,(pCVar17->super_Type).super_Symbol.name);
  return;
LAB_00208572:
  iVar30 = sVar33._M_end.current;
  this_02 = sVar33._M_begin.current;
  if (this_02.current == iVar30.current) goto LAB_002087d5;
  if (((this_02.current)->name)._M_len != 0) {
    SVar16 = ((Symbol *)&(this_02.current)->kind)->kind;
    if (SVar16 == MethodPrototype) {
      if ((this_02.current[3].kind & ScalarType) == Unknown) goto LAB_002085b9;
      pSVar23 = MethodPrototypeSymbol::getSubroutine((MethodPrototypeSymbol *)this_02.current);
      this->baseConstructor = &pSVar23->super_Symbol;
    }
    else if ((SVar16 == Subroutine) && ((this_02.current[3].field_0x4 & 8) != 0)) {
      this->baseConstructor = this_02.current;
    }
    else {
LAB_002085b9:
      uVar21 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         (this_01,&(this_02.current)->name);
      uVar28 = uVar21 >> ((byte)*this_01 & 0x3f);
      lVar29 = (uVar21 & 0xff) * 4;
      cVar9 = (&UNK_0042856c)[lVar29];
      cVar10 = (&UNK_0042856d)[lVar29];
      cVar11 = (&UNK_0042856e)[lVar29];
      bVar3 = (&UNK_0042856f)[lVar29];
      uVar26 = 0;
      do {
        lVar29 = *(long *)(this_01 + 0x10);
        pcVar1 = (char *)(lVar29 + uVar28 * 0x10);
        bVar14 = pcVar1[0xf];
        auVar31[0] = -(*pcVar1 == cVar9);
        auVar31[1] = -(pcVar1[1] == cVar10);
        auVar31[2] = -(pcVar1[2] == cVar11);
        auVar31[3] = -(pcVar1[3] == bVar3);
        auVar31[4] = -(pcVar1[4] == cVar9);
        auVar31[5] = -(pcVar1[5] == cVar10);
        auVar31[6] = -(pcVar1[6] == cVar11);
        auVar31[7] = -(pcVar1[7] == bVar3);
        auVar31[8] = -(pcVar1[8] == cVar9);
        auVar31[9] = -(pcVar1[9] == cVar10);
        auVar31[10] = -(pcVar1[10] == cVar11);
        auVar31[0xb] = -(pcVar1[0xb] == bVar3);
        auVar31[0xc] = -(pcVar1[0xc] == cVar9);
        auVar31[0xd] = -(pcVar1[0xd] == cVar10);
        auVar31[0xe] = -(pcVar1[0xe] == cVar11);
        auVar31[0xf] = -(bVar14 == bVar3);
        uVar15 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
        iVar30.current = iVar25.current;
        if (uVar15 != 0) {
          lVar7 = *(long *)(this_01 + 0x18);
          do {
            uVar8 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            bVar13 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                     operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                                this_01,&(this_02.current)->name,
                                (basic_string_view<char,_std::char_traits<char>_> *)
                                ((ulong)uVar8 * 0x18 + lVar7 + uVar28 * 0x168));
            if (bVar13) goto LAB_00208736;
            uVar15 = uVar15 - 1 & uVar15;
          } while (uVar15 != 0);
          bVar14 = *(byte *)(lVar29 + uVar28 * 0x10 + 0xf);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & bVar14) == 0) break;
        lVar29 = uVar28 + uVar26;
        uVar26 = uVar26 + 1;
        uVar28 = lVar29 + 1U & *(ulong *)(this_01 + 8);
      } while (uVar26 <= *(ulong *)(this_01 + 8));
      args.current = this_02.current;
      if (((Symbol *)&(this_02.current)->kind)->kind == TransparentMember) {
        args.current = this_02.current[1];
      }
      if (this->isAbstract == false) {
        SVar16 = ((Symbol *)&(args.current)->kind)->kind;
        if (SVar16 == MethodPrototype) {
          if (((((MethodPrototypeSymbol *)args.current)->flags).m_bits & 2) == 0) {
            SVar16 = ((Symbol *)&(args.current)->kind)->kind;
            goto LAB_002086f1;
          }
          if (bVar12) goto LAB_00208736;
          SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
          code_00.subsystem = Declarations;
          code_00.code = 0x4b;
        }
        else {
LAB_002086f1:
          if ((SVar16 != ConstraintBlock) ||
             (((ulong)(((MethodPrototypeSymbol *)args.current)->declaredReturnType).type & 2) == 0))
          goto LAB_00208700;
          if (bVar12) goto LAB_00208736;
          SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
          code_00.subsystem = Declarations;
          code_00.code = 0x4c;
        }
        pDVar18 = ASTContext::addDiag(context,code_00,SVar32);
        Diagnostic::operator<<(pDVar18,(this->super_Type).super_Symbol.name);
        Diagnostic::operator<<(pDVar18,(pCVar17->super_Type).super_Symbol.name);
        Diagnostic::operator<<(pDVar18,((Symbol *)&(args.current)->kind)->name);
        Diagnostic::addNote(pDVar18,(DiagCode)0x50001,((Symbol *)&(args.current)->kind)->location);
        bVar12 = true;
      }
      else {
LAB_00208700:
        pTVar22 = BumpAllocator::
                  emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                            (&this_00->super_BumpAllocator,args.current);
        (*insertCB.callback)(insertCB.callable,&pTVar22->super_Symbol);
      }
    }
  }
LAB_00208736:
  sVar33._M_end.current = iVar30.current;
  sVar33._M_begin.current = (this_02.current)->nextInScope;
  goto LAB_00208572;
LAB_002087d5:
  sVar33 = Scope::members(&this->super_Scope);
  iVar25 = sVar33._M_begin.current;
  do {
    if (iVar25.current == sVar33._M_end.current.current) {
      return;
    }
    SVar16 = ((Symbol *)&(iVar25.current)->kind)->kind;
    if (SVar16 == Subroutine) {
      pCVar20 = pCVar17;
      if (((((SubroutineSymbol *)iVar25.current)->flags).m_bits & 0xc) == 0) {
        while (pSVar23 = (SubroutineSymbol *)
                         Scope::find(&pCVar20->super_Scope,((Symbol *)&(iVar25.current)->kind)->name
                                    ), pSVar23 == (SubroutineSymbol *)0x0) {
          pTVar19 = getBaseClass(pCVar20);
          if (pTVar19 == (Type *)0x0) goto LAB_00208b4e;
          bVar12 = Type::isError(pTVar19);
          if (bVar12) goto LAB_002089f5;
          pCVar20 = (ClassType *)Type::getCanonicalType(pTVar19);
        }
        if ((pSVar23->super_Symbol).kind == Subroutine) {
          uVar5 = (((SubroutineSymbol *)iVar25.current)->flags).m_bits;
          uVar6 = (pSVar23->flags).m_bits;
          if (((uVar5 >> 0xd & 1) == 0) ||
             (((uVar6 & 0x4001) == 0 && (pSVar23->overrides == (SubroutineSymbol *)0x0)))) {
            if ((short)uVar6 < 0) {
              SVar27 = ((Symbol *)&(iVar25.current)->kind)->location;
              code_03.subsystem = Declarations;
              code_03.code = 0x91;
              goto LAB_00208c29;
            }
            if ((((uVar5 >> 0xe & 1) != 0) && ((uVar6 & 0x4001) == 0)) &&
               (pSVar23->overrides == (SubroutineSymbol *)0x0)) {
              pDVar18 = ASTContext::addDiag(context,(DiagCode)0x920005,
                                            ((Symbol *)&(iVar25.current)->kind)->location);
              Diagnostic::operator<<(pDVar18,((Symbol *)&(iVar25.current)->kind)->name);
            }
          }
          else {
            SVar27 = ((Symbol *)&(iVar25.current)->kind)->location;
            code_03.subsystem = Declarations;
            code_03.code = 0x92;
LAB_00208c29:
            pDVar18 = ASTContext::addDiag(context,code_03,SVar27);
            Diagnostic::operator<<(pDVar18,((Symbol *)&(iVar25.current)->kind)->name);
            Diagnostic::addNote(pDVar18,(DiagCode)0x50001,(pSVar23->super_Symbol).location);
          }
          if ((((pSVar23->flags).m_bits & 0x4001) != 0) ||
             (pSVar23->overrides != (SubroutineSymbol *)0x0)) {
            SubroutineSymbol::setOverride((SubroutineSymbol *)iVar25.current,pSVar23);
          }
        }
        else {
LAB_00208b4e:
          bVar3 = *(byte *)((long)&(((SubroutineSymbol *)iVar25.current)->flags).m_bits + 1);
joined_r0x00208b56:
          if ((bVar3 & 0x40) != 0) {
            pDVar18 = ASTContext::addDiag(context,(DiagCode)0x920005,
                                          ((Symbol *)&(iVar25.current)->kind)->location);
            Diagnostic::operator<<(pDVar18,((Symbol *)&(iVar25.current)->kind)->name);
          }
        }
      }
    }
    else {
      if (SVar16 != MethodPrototype) {
        pCVar20 = pCVar17;
        if (SVar16 == ConstraintBlock) {
          while (pSVar24 = Scope::find(&pCVar20->super_Scope,
                                       ((Symbol *)&(iVar25.current)->kind)->name),
                pSVar24 == (Symbol *)0x0) {
            pTVar19 = getBaseClass(pCVar20);
            if ((pTVar19 == (Type *)0x0) || (bVar12 = Type::isError(pTVar19), bVar12))
            goto LAB_002089c8;
            pCVar20 = (ClassType *)Type::getCanonicalType(pTVar19);
          }
          if (pSVar24->kind != ConstraintBlock) {
LAB_002089c8:
            bVar3 = *(byte *)&(((SubroutineSymbol *)iVar25.current)->declaredReturnType).type;
            goto joined_r0x00208b56;
          }
          uVar2 = (undefined1)pSVar24[2].kind;
          if (((uVar2 & Definition) != Unknown) &&
             ((byte)(uVar2 & DeferredMember) >> 2 !=
              (*(byte *)&(((SubroutineSymbol *)iVar25.current)->declaredReturnType).type & 4) >> 2))
          {
            pDVar18 = ASTContext::addDiag(context,(DiagCode)0x790006,
                                          ((Symbol *)&(iVar25.current)->kind)->location);
            Diagnostic::addNote(pDVar18,(DiagCode)0x50001,pSVar24->location);
          }
          if (((ulong)(((SubroutineSymbol *)iVar25.current)->declaredReturnType).type & 0x20) == 0)
          {
            if (-1 < (char)pSVar24[2].kind) goto LAB_002089f5;
            SVar27 = ((Symbol *)&(iVar25.current)->kind)->location;
            code_01.subsystem = Declarations;
            code_01.code = 0x91;
          }
          else {
            SVar27 = ((Symbol *)&(iVar25.current)->kind)->location;
            code_01.subsystem = Declarations;
            code_01.code = 0x92;
          }
          pDVar18 = ASTContext::addDiag(context,code_01,SVar27);
          Diagnostic::operator<<(pDVar18,((Symbol *)&(iVar25.current)->kind)->name);
          Diagnostic::addNote(pDVar18,(DiagCode)0x50001,pSVar24->location);
        }
        goto LAB_002089f5;
      }
      pCVar20 = pCVar17;
      if ((((SubroutineSymbol *)iVar25.current)->visibility & 0xc) == Public) {
        while (pSVar24 = Scope::find(&pCVar20->super_Scope,((Symbol *)&(iVar25.current)->kind)->name
                                    ), pSVar24 == (Symbol *)0x0) {
          pTVar19 = getBaseClass(pCVar20);
          if (pTVar19 == (Type *)0x0) goto LAB_00208a8b;
          bVar12 = Type::isError(pTVar19);
          if (bVar12) goto LAB_00208869;
          pCVar20 = (ClassType *)Type::getCanonicalType(pTVar19);
        }
        if (pSVar24->kind == Subroutine) {
          uVar4 = (undefined2)((SubroutineSymbol *)iVar25.current)->visibility;
          uVar5 = *(ushort *)&pSVar24[3].field_0x4;
          if ((((ushort)uVar4 >> 0xd & 1) == 0) ||
             (((uVar5 & 0x4001) == 0 && (pSVar24[4].name._M_len == 0)))) {
            if ((short)uVar5 < 0) {
              SVar27 = ((Symbol *)&(iVar25.current)->kind)->location;
              code_02.subsystem = Declarations;
              code_02.code = 0x91;
              goto LAB_00208bcb;
            }
            if (((((ushort)uVar4 >> 0xe & 1) != 0) && ((uVar5 & 0x4001) == 0)) &&
               (pSVar24[4].name._M_len == 0)) {
              pDVar18 = ASTContext::addDiag(context,(DiagCode)0x920005,
                                            ((Symbol *)&(iVar25.current)->kind)->location);
              Diagnostic::operator<<(pDVar18,((Symbol *)&(iVar25.current)->kind)->name);
            }
          }
          else {
            SVar27 = ((Symbol *)&(iVar25.current)->kind)->location;
            code_02.subsystem = Declarations;
            code_02.code = 0x92;
LAB_00208bcb:
            pDVar18 = ASTContext::addDiag(context,code_02,SVar27);
            Diagnostic::operator<<(pDVar18,((Symbol *)&(iVar25.current)->kind)->name);
            Diagnostic::addNote(pDVar18,(DiagCode)0x50001,pSVar24->location);
          }
          if (((*(ushort *)&pSVar24[3].field_0x4 & 0x4001) != 0) || (pSVar24[4].name._M_len != 0)) {
            (((SubroutineSymbol *)iVar25.current)->blocks)._M_extent._M_extent_value =
                 (size_t)pSVar24;
          }
        }
        else {
LAB_00208a8b:
          if ((((SubroutineSymbol *)iVar25.current)->visibility & 0x4000) != Public) {
            pDVar18 = ASTContext::addDiag(context,(DiagCode)0x920005,
                                          ((Symbol *)&(iVar25.current)->kind)->location);
            Diagnostic::operator<<(pDVar18,((Symbol *)&(iVar25.current)->kind)->name);
          }
        }
      }
LAB_00208869:
      pSVar23 = (SubroutineSymbol *)
                (((SubroutineSymbol *)iVar25.current)->blocks)._M_extent._M_extent_value;
      if ((pSVar23 != (SubroutineSymbol *)0x0) &&
         (derivedMethod =
               MethodPrototypeSymbol::getSubroutine((MethodPrototypeSymbol *)iVar25.current),
         derivedMethod != (SubroutineSymbol *)0x0)) {
        SubroutineSymbol::checkVirtualMethodMatch((context->scope).ptr,pSVar23,derivedMethod,true);
      }
    }
LAB_002089f5:
    iVar25.current = ((Symbol *)&(iVar25.current)->kind)->nextInScope;
  } while( true );
}

Assistant:

void ClassType::handleExtends(const ExtendsClauseSyntax& extendsClause, const ASTContext& context,
                              function_ref<void(const Symbol&)> insertCB) const {
    auto& comp = context.getCompilation();
    auto baseType = Lookup::findClass(*extendsClause.baseName, context);
    if (!baseType) {
        baseClass = &comp.getErrorType();
        return;
    }

    // A normal class can't extend an interface class. This method won't be called
    // for an interface class, so we don't need to check that again here.
    if (baseType->isInterface) {
        baseClass = &comp.getErrorType();
        context.addDiag(diag::ExtendIfaceFromClass, extendsClause.sourceRange()) << baseType->name;
        return;
    }

    if (baseType->isFinal) {
        baseClass = &comp.getErrorType();
        context.addDiag(diag::ExtendFromFinal, extendsClause.sourceRange()) << baseType->name;
        return;
    }

    // Make sure there are no cycles in the inheritance chain.
    auto currBase = baseType;
    while (true) {
        if (currBase == this) {
            context.addDiag(diag::ClassInheritanceCycle, extendsClause.sourceRange()) << name;
            baseClass = &comp.getErrorType();
            return;
        }

        auto next = currBase->getBaseClass();
        if (!next || next->isError())
            break;

        currBase = &next->getCanonicalType().as<ClassType>();
    }

    // Assign this member before resolving anything below, because they
    // may try to check the base class of this type.
    baseClass = baseType;

    // Inherit all base class members that don't conflict with our declared symbols.
    auto& scopeNameMap = getNameMap();
    bool pureVirtualError = false;

    for (auto& member : baseType->members()) {
        if (member.name.empty())
            continue;

        // Don't inherit constructors.
        if (member.kind == SymbolKind::Subroutine &&
            member.as<SubroutineSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = &member;
            continue;
        }
        if (member.kind == SymbolKind::MethodPrototype &&
            member.as<MethodPrototypeSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = member.as<MethodPrototypeSymbol>().getSubroutine();
            continue;
        }

        // Don't inherit if the member is already overridden.
        if (auto it = scopeNameMap.find(member.name); it != scopeNameMap.end())
            continue;

        // If the symbol itself was already inherited, create a new wrapper around
        // it for our own scope.
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        // If this is a pure virtual method being inherited and we aren't ourselves
        // an abstract class, issue an error.
        if (!isAbstract && toWrap->kind == SymbolKind::MethodPrototype) {
            auto& sub = toWrap->as<MethodPrototypeSymbol>();
            if (sub.flags.has(MethodFlags::Pure)) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstract,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << sub.name;
                    diag.addNote(diag::NoteDeclarationHere, sub.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        if (!isAbstract && toWrap->kind == SymbolKind::ConstraintBlock) {
            auto& cb = toWrap->as<ConstraintBlockSymbol>();
            if (cb.flags.has(ConstraintBlockFlags::Pure)) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstractConstraint,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << cb.name;
                    diag.addNote(diag::NoteDeclarationHere, cb.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        // All symbols get inserted into the beginning of the scope using the
        // provided insertion callback. We insert them as TransparentMemberSymbols
        // so that we can trace a path back to the actual location they are declared.
        auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
        insertCB(*wrapper);
    }

    auto checkOverrideSpecifiers = [&](auto& base, auto& derived) {
        if (derived.flags.has(MethodFlags::Initial) && base.isVirtual()) {
            auto& diag = context.addDiag(diag::OverridingInitial, derived.location);
            diag << derived.name;
            diag.addNote(diag::NoteDeclarationHere, base.location);
        }
        else if (base.flags.has(MethodFlags::Final)) {
            auto& diag = context.addDiag(diag::OverridingFinal, derived.location);
            diag << derived.name;
            diag.addNote(diag::NoteDeclarationHere, base.location);
        }
        else if (!base.isVirtual() && derived.flags.has(MethodFlags::Extends)) {
            context.addDiag(diag::OverridingExtends, derived.location) << derived.name;
        }
    };

    auto checkForOverride = [&](auto& member) {
        // Constructors and static methods can never be virtual.
        if (member.flags.has(MethodFlags::Constructor | MethodFlags::Static))
            return;

        // Look in the parent class for a method with the same name.
        auto currentBase = baseType;
        while (true) {
            const Symbol* found = currentBase->find(member.name);
            if (found) {
                if (found->kind == SymbolKind::Subroutine) {
                    auto& baseSub = found->as<SubroutineSymbol>();
                    checkOverrideSpecifiers(baseSub, member);
                    if (baseSub.isVirtual())
                        member.setOverride(baseSub);
                    return;
                }
                break;
            }

            // Otherwise it could be inherited from a higher-level base.
            auto possibleBase = currentBase->getBaseClass();
            if (!possibleBase)
                break;

            if (possibleBase->isError())
                return;

            currentBase = &possibleBase->getCanonicalType().as<ClassType>();
        }

        // No base method found; if our member is marked 'extends' it's an error.
        if (member.flags.has(MethodFlags::Extends))
            context.addDiag(diag::OverridingExtends, member.location) << member.name;
    };

    // Check all methods in our class for overriding virtual methods in parent classes.
    for (auto& member : members()) {
        if (member.kind == SymbolKind::Subroutine) {
            checkForOverride(member.as<SubroutineSymbol>());
        }
        else if (member.kind == SymbolKind::MethodPrototype) {
            auto& proto = member.as<MethodPrototypeSymbol>();
            checkForOverride(proto);

            if (auto baseSub = proto.getOverride()) {
                if (auto protoSub = proto.getSubroutine()) {
                    SubroutineSymbol::checkVirtualMethodMatch(*context.scope,
                                                              baseSub->as<SubroutineSymbol>(),
                                                              *protoSub,
                                                              /* allowDerivedReturn */ true);
                }
            }
        }
        else if (member.kind == SymbolKind::ConstraintBlock) {
            // Constraint blocks can also be overridden -- check that 'static'ness
            // matches between base and derived if the base is pure.
            bool isOverridden = false;
            auto currentBase = baseType;
            auto& derived = member.as<ConstraintBlockSymbol>();
            while (true) {
                const Symbol* found = currentBase->find(member.name);
                if (found) {
                    if (found->kind == SymbolKind::ConstraintBlock) {
                        isOverridden = true;
                        auto& baseConstraint = found->as<ConstraintBlockSymbol>();
                        if (baseConstraint.flags.has(ConstraintBlockFlags::Pure) &&
                            baseConstraint.flags.has(ConstraintBlockFlags::Static) !=
                                member.as<ConstraintBlockSymbol>().flags.has(
                                    ConstraintBlockFlags::Static)) {
                            auto& diag = context.addDiag(diag::MismatchStaticConstraint,
                                                         member.location);
                            diag.addNote(diag::NoteDeclarationHere, found->location);
                        }

                        if (derived.flags.has(ConstraintBlockFlags::Initial)) {
                            auto& diag = context.addDiag(diag::OverridingInitial, derived.location);
                            diag << derived.name;
                            diag.addNote(diag::NoteDeclarationHere, baseConstraint.location);
                        }
                        else if (baseConstraint.flags.has(ConstraintBlockFlags::Final)) {
                            auto& diag = context.addDiag(diag::OverridingFinal, derived.location);
                            diag << derived.name;
                            diag.addNote(diag::NoteDeclarationHere, baseConstraint.location);
                        }
                    }
                    break;
                }

                // Otherwise it could be inherited from a higher-level base.
                auto possibleBase = currentBase->getBaseClass();
                if (!possibleBase || possibleBase->isError())
                    break;

                currentBase = &possibleBase->getCanonicalType().as<ClassType>();
            }

            if (!isOverridden && derived.flags.has(ConstraintBlockFlags::Extends))
                context.addDiag(diag::OverridingExtends, member.location) << member.name;
        }
    }
}